

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.c
# Opt level: O2

void * allocLargePagesMemory(size_t bytes)

{
  void *pvVar1;
  
  pvVar1 = mmap((void *)0x0,bytes,3,0x48022,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

void* allocLargePagesMemory(size_t bytes) {
	void* mem;
	char *errfunc;
#if defined(_WIN32) || defined(__CYGWIN__)
	if (setPrivilege("SeLockMemoryPrivilege", 1, &errfunc))
		return NULL;
	size_t pageMinimum = GetLargePageMinimum();
	if (!pageMinimum) {
		errfunc = "No large pages";
		return NULL;
	}
	mem = VirtualAlloc(NULL, alignSize(bytes, pageMinimum), MEM_COMMIT | MEM_RESERVE | MEM_LARGE_PAGES, PAGE_READWRITE);
#else
#ifdef __APPLE__
	mem = mmap(NULL, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, VM_FLAGS_SUPERPAGE_SIZE_2MB, 0);
#elif defined(__FreeBSD__)
	mem = mmap(NULL, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS | MAP_ALIGNED_SUPER, -1, 0);
#elif defined(__OpenBSD__) || defined(__NetBSD__)
	mem = MAP_FAILED; // OpenBSD does not support huge pages
#else
	mem = mmap(NULL, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS | MAP_HUGETLB | MAP_POPULATE, -1, 0);
#endif
	if (mem == MAP_FAILED)
		mem = NULL;
#endif
	return mem;
}